

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSTSHarnessHandlers.hpp
# Opt level: O1

void __thiscall XSTSTest::XSTSTest(XSTSTest *this)

{
  MemoryManager *pMVar1;
  XMLURL **ppXVar2;
  
  pMVar1 = xercesc_4_0::XMLPlatformUtils::fgMemoryManager;
  (this->fXSDNames).super_BaseRefVectorOf<xercesc_4_0::XMLURL>._vptr_BaseRefVectorOf =
       (_func_int **)&PTR__BaseRefVectorOf_00112970;
  (this->fXSDNames).super_BaseRefVectorOf<xercesc_4_0::XMLURL>.fAdoptedElems = true;
  (this->fXSDNames).super_BaseRefVectorOf<xercesc_4_0::XMLURL>.fCurCount = 0;
  (this->fXSDNames).super_BaseRefVectorOf<xercesc_4_0::XMLURL>.fMaxCount = 1;
  (this->fXSDNames).super_BaseRefVectorOf<xercesc_4_0::XMLURL>.fElemList = (XMLURL **)0x0;
  (this->fXSDNames).super_BaseRefVectorOf<xercesc_4_0::XMLURL>.fMemoryManager = pMVar1;
  ppXVar2 = (XMLURL **)(**(code **)(*(long *)pMVar1 + 0x18))(pMVar1,8);
  (this->fXSDNames).super_BaseRefVectorOf<xercesc_4_0::XMLURL>.fElemList = ppXVar2;
  *ppXVar2 = (XMLURL *)0x0;
  (this->fXSDNames).super_BaseRefVectorOf<xercesc_4_0::XMLURL>._vptr_BaseRefVectorOf =
       (_func_int **)&PTR__RefVectorOf_001128f8;
  xercesc_4_0::XMLURL::XMLURL(&this->fXMLName,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLURL::XMLURL(&this->fSpecReference,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  this->fTestName[0] = L'\0';
  this->fExpectedResult = unknown;
  this->fSkipped = false;
  return;
}

Assistant:

XSTSTest() :
      fXSDNames(1) 
    {
        fTestName[0]=0;
        fExpectedResult=unknown;
        fSkipped=false;
    }